

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_service_base.hpp
# Opt level: O0

size_t __thiscall
asio::detail::reactive_socket_service_base::receive<asio::mutable_buffers_1>
          (reactive_socket_service_base *this,base_implementation_type *impl,
          mutable_buffers_1 *buffers,message_flags flags,error_code *ec)

{
  state_type state;
  socket_type s;
  void *data;
  size_t sVar1;
  mutable_buffer local_50;
  mutable_buffer local_40;
  error_code *local_30;
  error_code *ec_local;
  mutable_buffers_1 *pmStack_20;
  message_flags flags_local;
  mutable_buffers_1 *buffers_local;
  base_implementation_type *impl_local;
  reactive_socket_service_base *this_local;
  
  s = impl->socket_;
  state = impl->state_;
  local_30 = ec;
  ec_local._4_4_ = flags;
  pmStack_20 = buffers;
  buffers_local = (mutable_buffers_1 *)impl;
  impl_local = (base_implementation_type *)this;
  local_40 = buffer_sequence_adapter<asio::mutable_buffer,_asio::mutable_buffers_1>::first(buffers);
  data = mutable_buffer::data(&local_40);
  local_50 = buffer_sequence_adapter<asio::mutable_buffer,_asio::mutable_buffers_1>::first
                       (pmStack_20);
  sVar1 = mutable_buffer::size(&local_50);
  sVar1 = socket_ops::sync_recv1(s,state,data,sVar1,ec_local._4_4_,local_30);
  return sVar1;
}

Assistant:

size_t receive(base_implementation_type& impl,
      const MutableBufferSequence& buffers,
      socket_base::message_flags flags, asio::error_code& ec)
  {
    typedef buffer_sequence_adapter<asio::mutable_buffer,
        MutableBufferSequence> bufs_type;

    if (bufs_type::is_single_buffer)
    {
      return socket_ops::sync_recv1(impl.socket_,
          impl.state_, bufs_type::first(buffers).data(),
          bufs_type::first(buffers).size(), flags, ec);
    }
    else
    {
      bufs_type bufs(buffers);
      return socket_ops::sync_recv(impl.socket_, impl.state_,
          bufs.buffers(), bufs.count(), flags, bufs.all_empty(), ec);
    }
  }